

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O0

void __thiscall Satyricon::Literal_Heap::initialize(Literal_Heap *this)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  reference pvVar4;
  size_type sVar5;
  int __c;
  int __c_00;
  value_type *pvVar6;
  int local_20;
  Literal local_1c;
  int i_1;
  int local_14;
  Literal l;
  int i;
  Literal_Heap *this_local;
  
  _l = this;
  std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::clear(&this->value);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->map_position);
  std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::reserve(&this->value,sVar2);
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->map_position);
    if ((int)(sVar2 >> 1) <= iVar1) break;
    Literal::Literal((Literal *)&i_1,local_14,false);
    pvVar6 = (value_type *)&i_1;
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::push_back
              (&this->value,pvVar6);
    sVar2 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value)
    ;
    pcVar3 = Literal::index((Literal *)&i_1,(char *)pvVar6,__c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->map_position,(ulong)pcVar3 & 0xffffffff);
    *pvVar4 = (int)sVar2 + -1;
    Literal::Literal(&local_1c,local_14,true);
    i_1 = local_1c.value;
    pvVar6 = (value_type *)&i_1;
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::push_back
              (&this->value,pvVar6);
    sVar2 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value)
    ;
    pcVar3 = Literal::index((Literal *)&i_1,(char *)pvVar6,__c_00);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->map_position,(ulong)pcVar3 & 0xffffffff);
    *pvVar4 = (int)sVar2 + -1;
    local_14 = local_14 + 1;
  }
  sVar2 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->map_position);
  if (sVar2 == sVar5) {
    sVar2 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value)
    ;
    for (local_20 = (int)(sVar2 >> 1); -1 < local_20; local_20 = local_20 + -1) {
      heapify(this,(long)local_20);
    }
    return;
  }
  __assert_fail("value.size() == map_position.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                ,0xdf,"void Satyricon::Literal_Heap::initialize()");
}

Assistant:

void initialize() {
        value.clear();
        value.reserve(map_position.size());

        for ( int i = 0; i < static_cast<int>(map_position.size()/2); ++i ) {

            Literal l(i,false);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

            l = Literal(i,true);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

        }
        assert( value.size() == map_position.size());

        for ( int i = value.size()/2; i >= 0; --i )
            heapify(i);

    }